

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

upb_Arena * upb_Arena_Init(void *mem,size_t n,upb_alloc *alloc)

{
  char *pcVar1;
  void *ptr;
  uintptr_t uVar2;
  upb_Arena *puVar3;
  ulong uVar4;
  size_t block_size;
  
  if (mem != (void *)0x0) {
    puVar3 = (upb_Arena *)((long)mem + 7U & 0xfffffffffffffff8);
    uVar4 = 0;
    if ((ulong)((long)puVar3 - (long)mem) <= n) {
      uVar4 = n - ((long)puVar3 - (long)mem);
    }
    if ((puVar3 != (upb_Arena *)0x0) && (0x47 < uVar4)) {
      puVar3[2].ptr_dont_copy_me__upb_internal_use_only = (char *)0x3;
      puVar3[2].end_dont_copy_me__upb_internal_use_only = (char *)0x0;
      puVar3[3].ptr_dont_copy_me__upb_internal_use_only =
           (char *)((long)&puVar3[1].ptr_dont_copy_me__upb_internal_use_only + 1);
      puVar3[1].end_dont_copy_me__upb_internal_use_only = (char *)0x0;
      puVar3[3].end_dont_copy_me__upb_internal_use_only = (char *)0x0;
      puVar3[4].ptr_dont_copy_me__upb_internal_use_only = (char *)0x0;
      pcVar1 = (char *)_upb_Arena_MakeBlockAlloc(alloc,true);
      puVar3[1].ptr_dont_copy_me__upb_internal_use_only = pcVar1;
      puVar3->ptr_dont_copy_me__upb_internal_use_only =
           (char *)&puVar3[4].end_dont_copy_me__upb_internal_use_only;
      puVar3->end_dont_copy_me__upb_internal_use_only =
           (char *)((long)&puVar3->ptr_dont_copy_me__upb_internal_use_only + uVar4);
      return puVar3;
    }
    n = 0;
    if (puVar3 == (upb_Arena *)0x0) {
      n = uVar4;
    }
  }
  block_size = 0x158;
  if (0xff < n + 7) {
    block_size = (n + 7 & 0xfffffffffffffff8) + 0x58;
  }
  puVar3 = (upb_Arena *)0x0;
  if ((alloc != (upb_alloc *)0x0) &&
     (ptr = (*alloc->func)(alloc,(void *)0x0,0,block_size), ptr != (void *)0x0)) {
    puVar3 = (upb_Arena *)((long)ptr + 0x10);
    uVar2 = _upb_Arena_MakeBlockAlloc(alloc,false);
    *(uintptr_t *)((long)ptr + 0x20) = uVar2;
    *(undefined8 *)((long)ptr + 0x30) = 3;
    *(undefined8 *)((long)ptr + 0x38) = 0;
    *(ulong *)((long)ptr + 0x40) = (long)ptr + 0x20U | 1;
    *(size_t *)((long)ptr + 0x50) = block_size;
    *(undefined8 *)((long)ptr + 0x48) = 0;
    *(undefined8 *)((long)ptr + 0x28) = 0;
    _upb_Arena_AddBlock(puVar3,ptr,0x58,block_size);
  }
  return puVar3;
}

Assistant:

upb_Arena* upb_Arena_Init(void* mem, size_t n, upb_alloc* alloc) {
  UPB_ASSERT(sizeof(void*) * UPB_ARENA_SIZE_HACK >= sizeof(upb_ArenaState));
  upb_ArenaState* a;

  if (mem) {
    /* Align initial pointer up so that we return properly-aligned pointers. */
    void* aligned = (void*)UPB_ALIGN_MALLOC((uintptr_t)mem);
    size_t delta = (uintptr_t)aligned - (uintptr_t)mem;
    n = delta <= n ? n - delta : 0;
    mem = aligned;
  }
  if (UPB_UNLIKELY(n < sizeof(upb_ArenaState) || !mem)) {
    upb_Arena* ret = _upb_Arena_InitSlow(alloc, mem ? 0 : n);
#ifdef UPB_TRACING_ENABLED
    upb_Arena_LogInit(ret, n);
#endif
    return ret;
  }

  a = mem;

  upb_Atomic_Init(&a->body.parent_or_count, _upb_Arena_TaggedFromRefcount(1));
  upb_Atomic_Init(&a->body.next, NULL);
  upb_Atomic_Init(&a->body.previous_or_tail,
                  _upb_Arena_TaggedFromTail(&a->body));
  upb_Atomic_Init(&a->body.space_allocated, 0);
  a->body.blocks = NULL;
  a->body.upb_alloc_cleanup = NULL;
  a->body.block_alloc = _upb_Arena_MakeBlockAlloc(alloc, 1);
  a->head.UPB_PRIVATE(ptr) = (void*)UPB_ALIGN_MALLOC((uintptr_t)(a + 1));
  a->head.UPB_PRIVATE(end) = UPB_PTR_AT(mem, n, char);
  UPB_TSAN_INIT_PUBLISHED(&a->body);
#ifdef UPB_TRACING_ENABLED
  upb_Arena_LogInit(&a->head, n);
#endif
  return &a->head;
}